

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

cmFileListGeneratorBase * __thiscall
cmFileListGeneratorBase::SetNext(cmFileListGeneratorBase *this,cmFileListGeneratorBase *next)

{
  cmFileListGeneratorBase *pcVar1;
  auto_ptr<cmFileListGeneratorBase> local_28;
  cmFileListGeneratorBase *local_20;
  cmFileListGeneratorBase *local_18;
  cmFileListGeneratorBase *next_local;
  cmFileListGeneratorBase *this_local;
  
  local_18 = next;
  next_local = this;
  (*next->_vptr_cmFileListGeneratorBase[3])(&local_28);
  local_20 = (cmFileListGeneratorBase *)
             cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_28);
  cmsys::auto_ptr<cmFileListGeneratorBase>::operator=
            (&this->Next,(auto_ptr_ref<cmFileListGeneratorBase>)local_20);
  cmsys::auto_ptr<cmFileListGeneratorBase>::~auto_ptr(&local_28);
  pcVar1 = cmsys::auto_ptr<cmFileListGeneratorBase>::get(&this->Next);
  return pcVar1;
}

Assistant:

cmFileListGeneratorBase*
cmFileListGeneratorBase::SetNext(cmFileListGeneratorBase const& next)
{
  this->Next = next.Clone();
  return this->Next.get();
}